

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O3

string * __thiscall
gl4cts::ShaderSubroutine::NegativeTest11::getVertexShader_abi_cxx11_
          (string *__return_storage_ptr__,NegativeTest11 *this,_test_case *test_case)

{
  ulong uVar1;
  stringstream result_sstream;
  stringstream local_1a0 [16];
  undefined1 local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"#version 400\n\n#extension GL_ARB_shader_subroutine : require\n",
             0x3c);
  if (*test_case == TEST_CASE_INVALID_ATOMIC_COUNTER_USAGE_ATTEMPT) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,"#extension GL_ARB_shader_atomic_counters : require\n",0x33);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,
             "\nsubroutine void subroutineType(inout vec4 test);\n\nsubroutine(subroutineType) void test_function(inout vec4 test)\n{\n    test += vec4(0, 1, 2, 3);\n}\n\nsubroutine uniform subroutineType function;\n\nvoid main()\n{\n"
             ,0xd0);
  uVar1 = (ulong)*test_case;
  if (uVar1 < 3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,&DAT_01a56f70 + *(int *)(&DAT_01a56f70 + uVar1 * 4),
               *(long *)(&DAT_01a56f80 + uVar1 * 8));
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"}\n",2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base((ios_base *)(local_190 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

std::string NegativeTest11::getVertexShader(const _test_case& test_case)
{
	std::stringstream result_sstream;

	/* Form pre-amble */
	result_sstream << "#version 400\n"
					  "\n"
					  "#extension GL_ARB_shader_subroutine : require\n";

	if (test_case == TEST_CASE_INVALID_ATOMIC_COUNTER_USAGE_ATTEMPT)
	{
		result_sstream << "#extension GL_ARB_shader_atomic_counters : require\n";
	}

	result_sstream << "\n"
					  /* Define a subroutine */
					  "subroutine void subroutineType(inout vec4 test);\n"
					  "\n"
					  "subroutine(subroutineType) void test_function(inout vec4 test)\n"
					  "{\n"
					  "    test += vec4(0, 1, 2, 3);\n"
					  "}\n"
					  "\n"
					  "subroutine uniform subroutineType function;\n"
					  "\n"

					  /* Define main() body */
					  "void main()\n"
					  "{\n";

	/* Implement case-specific behavior */
	switch (test_case)
	{
	case TEST_CASE_INVALID_ATOMIC_COUNTER_USAGE_ATTEMPT:
	{
		result_sstream << "if (atomicCounter(function) > 2)\n"
						  "{\n"
						  "    gl_Position = vec4(1);\n"
						  "}\n";

		break;
	}

	case TEST_CASE_INVALID_IMAGE_FUNCTION_USAGE_ATTEMPT:
	{
		result_sstream << "imageStore(function, vec2(0.0, 1.0), vec4(1.0) );\n";

		break;
	}

	case TEST_CASE_INVALID_TEXTURE_SAMPLING_ATTEMPT:
	{
		result_sstream << "gl_Position = texture(function, vec2(1.0) );\n";

		break;
	}

	default:
		break;
	} /* switch (test_case) */

	/* Close main() body */
	result_sstream << "}\n";

	/* Done */
	return result_sstream.str();
}